

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O0

String * __thiscall asl::String::operator=(String *this,String *s)

{
  char *b;
  String *s_local;
  String *this_local;
  
  b = str(s);
  assign(this,b,s->_len);
  return this;
}

Assistant:

String& operator=(const String& s) { assign(s.str(), s._len); return *this; }